

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QLayoutItem_*>::replace(QList<QLayoutItem_*> *this,qsizetype i,parameter_type t)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QLayoutItem_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QLayoutItem **)0x0;
  local_48.size = 0;
  QArrayDataPointer<QLayoutItem_*>::detach(&this->d,&local_48);
  (this->d).ptr[i] = t;
  QArrayDataPointer<QLayoutItem_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, parameter_type t)
    {
        Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
        DataPointer oldData;
        d.detach(&oldData);
        d.data()[i] = t;
    }